

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O0

string * VRSString_abi_cxx11_(uint8_t **pStart)

{
  char *pcVar1;
  ulong uVar2;
  long *in_RSI;
  string *in_RDI;
  char *pS;
  size_t sLen;
  allocator local_21;
  char *local_20;
  ulong local_18;
  
  uVar2 = (ulong)*(byte *)*in_RSI;
  *in_RSI = *in_RSI + 1;
  pcVar1 = (char *)*in_RSI;
  *in_RSI = *in_RSI + uVar2;
  local_20 = pcVar1;
  local_18 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return in_RDI;
}

Assistant:

std::string VRSString (const uint8_t* &pStart)
{
    size_t sLen = size_t(pStart[0]);
    ++pStart;                           // eat the length byte
    const char* pS = (const char*)pStart;
    pStart += sLen;                     // eat the actual string
    return std::string(pS, sLen);
}